

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_embedded_file.cpp
# Opt level: O0

bool __thiscall ON_Buffer::Uncompress(ON_Buffer *this,ON_Buffer *uncompressed_buffer)

{
  byte bVar1;
  bool bVar2;
  ON__UINT32 OVar3;
  ON__UINT32 OVar4;
  ON__UINT64 OVar5;
  ON__UINT64 OVar6;
  ulong local_d0;
  ON_Buffer *local_c0;
  ON__UINT64 pos1;
  ON_BUFFER_SEGMENT *seg;
  ON_BUFFER_SEGMENT *prev_seg;
  ON__UINT64 compressed_size;
  ON_Buffer *out;
  ON_UncompressStream uncompressor;
  bool rc;
  ON_Buffer *uncompressed_buffer_local;
  ON_Buffer *this_local;
  
  uncompressor.m_reserved._7_1_ = 0;
  ON_UncompressStream::ON_UncompressStream((ON_UncompressStream *)&out);
  local_c0 = uncompressed_buffer;
  if (this == uncompressed_buffer) {
    local_c0 = (ON_Buffer *)operator_new(0x40);
    ON_Buffer(local_c0);
  }
  Destroy(local_c0);
  OVar5 = Size(this);
  if (((OVar5 != 0) &&
      (bVar2 = ON_UncompressStream::SetCallback
                         ((ON_UncompressStream *)&out,ON_Buffer_StreamCallback,local_c0), bVar2)) &&
     (bVar2 = ON_UncompressStream::Begin((ON_UncompressStream *)&out), bVar2)) {
    seg = (ON_BUFFER_SEGMENT *)0x0;
    for (pos1 = (ON__UINT64)this->m_first_segment; pos1 != 0; pos1 = *(ON__UINT64 *)(pos1 + 8)) {
      local_d0 = OVar5;
      if (*(ulong *)(pos1 + 0x18) <= OVar5) {
        local_d0 = *(ulong *)(pos1 + 0x18);
      }
      if ((local_d0 < *(ulong *)(pos1 + 0x10)) || (seg != *(ON_BUFFER_SEGMENT **)pos1)) break;
      if (seg == (ON_BUFFER_SEGMENT *)0x0) {
        if (*(long *)(pos1 + 0x10) != 0) break;
      }
      else if (seg->m_segment_position1 != *(ON__UINT64 *)(pos1 + 0x10)) break;
      bVar2 = ON_UncompressStream::In
                        ((ON_UncompressStream *)&out,local_d0 - *(long *)(pos1 + 0x10),
                         *(void **)(pos1 + 0x20));
      if (!bVar2) break;
      seg = (ON_BUFFER_SEGMENT *)pos1;
    }
    if (((pos1 == 0) && (bVar2 = ON_UncompressStream::End((ON_UncompressStream *)&out), bVar2)) &&
       (OVar6 = ON_UncompressStream::InSize((ON_UncompressStream *)&out), OVar6 == OVar5)) {
      OVar3 = ON_UncompressStream::InCRC((ON_UncompressStream *)&out);
      OVar4 = CRC32(this,0);
      if (OVar3 == OVar4) {
        OVar5 = ON_UncompressStream::OutSize((ON_UncompressStream *)&out);
        OVar6 = Size(local_c0);
        if (OVar5 == OVar6) {
          OVar3 = ON_UncompressStream::OutCRC((ON_UncompressStream *)&out);
          OVar4 = CRC32(local_c0,0);
          if (OVar3 == OVar4) {
            uncompressor.m_reserved._7_1_ = 1;
          }
        }
      }
    }
  }
  if ((uncompressor.m_reserved._7_1_ & 1) == 0) {
    Destroy(local_c0);
    if ((this == uncompressed_buffer) && (local_c0 != (ON_Buffer *)0x0)) {
      ~ON_Buffer(local_c0);
      operator_delete(local_c0,0x40);
    }
  }
  else {
    Compact(local_c0);
    local_c0->m_current_position = 0;
    local_c0->m_current_segment = (ON_BUFFER_SEGMENT *)0x0;
    if (this == uncompressed_buffer) {
      Destroy(uncompressed_buffer);
      uncompressed_buffer->m_buffer_size = local_c0->m_buffer_size;
      uncompressed_buffer->m_current_position = local_c0->m_current_position;
      uncompressed_buffer->m_first_segment = local_c0->m_first_segment;
      uncompressed_buffer->m_last_segment = local_c0->m_last_segment;
      uncompressed_buffer->m_current_segment = local_c0->m_current_segment;
      uncompressed_buffer->m_error_handler = local_c0->m_error_handler;
      uncompressed_buffer->m_last_error = local_c0->m_last_error;
      local_c0->m_first_segment = (ON_BUFFER_SEGMENT *)0x0;
      local_c0->m_last_segment = (ON_BUFFER_SEGMENT *)0x0;
      local_c0->m_current_segment = (ON_BUFFER_SEGMENT *)0x0;
      local_c0->m_buffer_size = 0;
      if (local_c0 != (ON_Buffer *)0x0) {
        ~ON_Buffer(local_c0);
        operator_delete(local_c0,0x40);
      }
    }
  }
  bVar1 = uncompressor.m_reserved._7_1_;
  ON_UncompressStream::~ON_UncompressStream((ON_UncompressStream *)&out);
  return (bool)(bVar1 & 1);
}

Assistant:

bool ON_Buffer::Uncompress( ON_Buffer& uncompressed_buffer ) const
{
  bool rc = false;
  ON_UncompressStream uncompressor;
  ON_Buffer* out = ( this == &uncompressed_buffer ) ? new ON_Buffer() : &uncompressed_buffer;

  out->Destroy();

  for (;;)
  {
    ON__UINT64 compressed_size = Size();
    if ( compressed_size <= 0 )
      break;
    if ( !uncompressor.SetCallback(ON_Buffer_StreamCallback,out) )
      break;
    if ( !uncompressor.Begin() )
      break;

    struct ON_BUFFER_SEGMENT* prev_seg = 0;
    struct ON_BUFFER_SEGMENT* seg = 0;
    for ( seg = m_first_segment; 0 != seg; seg = seg->m_next_segment )
    {
      const ON__UINT64 pos1 = (compressed_size < seg->m_segment_position1)
                            ? compressed_size 
                            : seg->m_segment_position1;
      if ( pos1 < seg->m_segment_position0 )
        break;
      if ( prev_seg != seg->m_prev_segment )
        break;
      if ( 0 == prev_seg )
      {
        if ( 0 != seg->m_segment_position0 )
          break;
      }
      else
      {
        if ( prev_seg->m_segment_position1 != seg->m_segment_position0 )
          break;
      }
      if ( !uncompressor.In(pos1 - seg->m_segment_position0,seg->m_segment_buffer) )
        break;
      prev_seg = seg;
    }
    if ( 0 != seg )
      break;

    if ( !uncompressor.End() )
      break;

    if ( uncompressor.InSize() != compressed_size )
      break;
    if ( uncompressor.InCRC() != CRC32(0) )
      break;
    if ( uncompressor.OutSize() != out->Size() )
      break;
    if ( uncompressor.OutCRC() != out->CRC32(0) )
      break;

    rc = true;
    break;
  }

  if ( !rc )
  {
    out->Destroy();
    if ( this == &uncompressed_buffer )
      delete out;
  }
  else
  {
    out->Compact();
    out->m_current_position = 0;
    out->m_current_segment = 0;
    if ( this == &uncompressed_buffer )
    {
      // transfer "out" to "this"
      uncompressed_buffer.Destroy();
      uncompressed_buffer.m_buffer_size = out->m_buffer_size;
      uncompressed_buffer.m_current_position = out->m_current_position;
      uncompressed_buffer.m_first_segment = out->m_first_segment;
      uncompressed_buffer.m_last_segment = out->m_last_segment;
      uncompressed_buffer.m_current_segment = out->m_current_segment;
      uncompressed_buffer.m_error_handler = out->m_error_handler;
      uncompressed_buffer.m_last_error = out->m_last_error;
      
      out->m_first_segment = 0;
      out->m_last_segment = 0;
      out->m_current_segment = 0;
      out->m_buffer_size = 0;
      delete out;
    }
  }

  return rc;
}